

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzAddWMod(word *b,word *a,word w,word *mod,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar1 = 1;
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    uVar2 = w + a[sVar3];
    w = (word)CARRY8(w,a[sVar3]);
    b[sVar3] = uVar2;
    if (mod[sVar3] != uVar2) {
      uVar1 = 0;
    }
    uVar1 = uVar1 | mod[sVar3] < uVar2;
  }
  zzSubAndW(b,mod,n,-(uVar1 | w));
  return;
}

Assistant:

void SAFE(zzAddWMod)(word b[], const word a[], register word w, 
	const word mod[], size_t n)
{
	register word mask = 1;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmpW(mod, n, w) > 0);
	// add
	for (i = 0; i < n; ++i)
	{
		b[i] = a[i] + w;
		w = wordLess01(b[i], w);
		// mask <-  mod[i] < b[i] | mask & mod[i] == b[i];
		mask &= wordEq01(mod[i], b[i]);
		mask |= wordLess01(mod[i], b[i]);
	}
	// sub
	mask |= w;
	mask = WORD_0 - mask;
	zzSubAndW(b, mod, n, mask);
	mask = w = 0;
}